

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_motion.c
# Opt level: O1

int av1_hash_is_horizontal_perfect
              (YV12_BUFFER_CONFIG *picture,int block_size,int x_start,int y_start)

{
  bool bVar1;
  long lVar2;
  uint8_t *puVar3;
  short *psVar4;
  int iVar5;
  ulong uVar6;
  
  lVar2 = (long)(picture->field_4).field_0.y_stride;
  puVar3 = (picture->field_5).buffers[0] + (long)x_start + y_start * lVar2;
  bVar1 = 0 < block_size;
  if ((picture->flags & 8) == 0) {
    if (0 < block_size) {
      iVar5 = 0;
      do {
        if (block_size != 1) {
          uVar6 = 1;
          do {
            if (puVar3[uVar6] != *puVar3) {
LAB_001d0c2d:
              if (!bVar1) {
                return 1;
              }
              return 0;
            }
            uVar6 = uVar6 + 1;
          } while ((uint)block_size != uVar6);
        }
        puVar3 = puVar3 + lVar2;
        iVar5 = iVar5 + 1;
        bVar1 = iVar5 < block_size;
      } while (iVar5 != block_size);
    }
  }
  else if (0 < block_size) {
    psVar4 = (short *)((long)puVar3 * 2);
    iVar5 = 0;
    do {
      if (block_size != 1) {
        uVar6 = 1;
        do {
          if (psVar4[uVar6] != *psVar4) goto LAB_001d0c2d;
          uVar6 = uVar6 + 1;
        } while ((uint)block_size != uVar6);
      }
      psVar4 = psVar4 + lVar2;
      iVar5 = iVar5 + 1;
      bVar1 = iVar5 < block_size;
    } while (iVar5 != block_size);
  }
  return 1;
}

Assistant:

int av1_hash_is_horizontal_perfect(const YV12_BUFFER_CONFIG *picture,
                                   int block_size, int x_start, int y_start) {
  const int stride = picture->y_stride;
  const uint8_t *p = picture->y_buffer + y_start * stride + x_start;

  if (picture->flags & YV12_FLAG_HIGHBITDEPTH) {
    const uint16_t *p16 = CONVERT_TO_SHORTPTR(p);
    for (int i = 0; i < block_size; i++) {
      for (int j = 1; j < block_size; j++) {
        if (p16[j] != p16[0]) {
          return 0;
        }
      }
      p16 += stride;
    }
  } else {
    for (int i = 0; i < block_size; i++) {
      for (int j = 1; j < block_size; j++) {
        if (p[j] != p[0]) {
          return 0;
        }
      }
      p += stride;
    }
  }

  return 1;
}